

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

hashelement_t * install(char *b,char *l,char *r,char *wp,hashelement_t **hashtable)

{
  uint uVar1;
  hashelement_t *phVar2;
  char *pcVar3;
  
  phVar2 = lookup(b,l,r,wp,hashtable);
  if (phVar2 == (hashelement_t *)0x0) {
    phVar2 = (hashelement_t *)calloc(1,0x30);
    if (phVar2 != (hashelement_t *)0x0) {
      pcVar3 = strdup(b);
      phVar2->basephone = pcVar3;
      if (pcVar3 != (char *)0x0) {
        pcVar3 = strdup(l);
        phVar2->leftcontext = pcVar3;
        if (pcVar3 != (char *)0x0) {
          pcVar3 = strdup(r);
          phVar2->rightcontext = pcVar3;
          if (pcVar3 != (char *)0x0) {
            pcVar3 = strdup(wp);
            phVar2->wordposition = pcVar3;
            if (pcVar3 != (char *)0x0) {
              phVar2->dictcount = 0;
              phVar2->count = 0;
              uVar1 = hash(b,l,r,wp);
              phVar2->next = hashtable[uVar1];
              hashtable[uVar1] = phVar2;
              return phVar2;
            }
          }
        }
      }
    }
    phVar2 = (hashelement_t *)0x0;
  }
  return phVar2;
}

Assistant:

hashelement_t *install(const char *b, const char *l, const char *r, const char *wp, 
			hashelement_t **hashtable)
{
    hashelement_t  *np;
    unsigned hashval;

    if ((np = lookup(b, l, r, wp, hashtable)) == NULL)
    {
        np = (hashelement_t *) calloc (1,sizeof(*np));
        if (np == NULL || 
	    (np->basephone = strdup(b)) == NULL || 
	    (np->leftcontext = strdup(l)) == NULL ||
	    (np->rightcontext = strdup(r)) == NULL ||
	    (np->wordposition = strdup(wp)) == NULL)
            return NULL;

        np->dictcount = 0;
	np->count = 0;
        hashval = hash(b,l,r,wp);
        np->next = hashtable[hashval];
        hashtable[hashval] = np;
    }
    return np;
}